

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Error * ot::commissioner::Interpreter::ParseChannelMask
                  (Error *__return_storage_ptr__,ChannelMask *aChannelMask,Expression *aExpr,
                  size_t aIndex)

{
  bool bVar1;
  pointer puVar2;
  size_type sVar3;
  pointer puVar4;
  const_reference pvVar5;
  Error *pEVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  string_view fmt;
  format_args args;
  ErrorCode local_1c4;
  Error local_1c0;
  ErrorCode local_194;
  Error local_190;
  undefined1 local_168 [8];
  ChannelMaskEntry entry;
  size_t i;
  anon_class_1_0_00000001 local_12a;
  v10 local_129;
  v10 *local_128;
  size_t local_120;
  string local_118;
  Error local_f8;
  byte local_c9;
  pointer local_c8;
  size_t aIndex_local;
  Expression *aExpr_local;
  ChannelMask *aChannelMask_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_c9 = 0;
  local_c8 = (pointer)aIndex;
  aIndex_local = (size_t)aExpr;
  aExpr_local = (Expression *)aChannelMask;
  aChannelMask_local = (ChannelMask *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  puVar2 = (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)aIndex_local);
  if ((puVar2 < local_c8) ||
     (sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)aIndex_local), (sVar3 - (long)local_c8 & 1) != 0)) {
    ParseChannelMask::anon_class_1_0_00000001::operator()(&local_12a);
    local_58 = &local_128;
    local_60 = &local_129;
    bVar7 = ::fmt::v10::operator()(local_60);
    local_120 = bVar7.size_;
    local_128 = (v10 *)bVar7.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_118;
    local_78 = local_128;
    sStack_70 = local_120;
    local_50 = &local_78;
    local_88 = local_128;
    local_80 = local_120;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_118,local_88,fmt,args);
    Error::Error(&local_f8,kInvalidArgs,&local_118);
    Error::operator=(__return_storage_ptr__,&local_f8);
    Error::~Error(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    for (entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = local_c8;
        puVar2 = entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
        puVar4 = (pointer)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)aIndex_local), puVar2 < puVar4;
        entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 2) {
      ChannelMaskEntry::ChannelMaskEntry((ChannelMaskEntry *)local_168);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)aIndex_local,
                            (size_type)
                            entry.mMasks.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      utils::ParseInteger<unsigned_char>(&local_190,local_168,pvVar5);
      pEVar6 = Error::operator=(__return_storage_ptr__,&local_190);
      local_194 = kNone;
      bVar1 = commissioner::operator!=(pEVar6,&local_194);
      Error::~Error(&local_190);
      if (bVar1) {
        bVar1 = true;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)aIndex_local,
                              (size_type)
                              (entry.mMasks.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        utils::Hex(&local_1c0,(ByteArray *)&entry,pvVar5);
        pEVar6 = Error::operator=(__return_storage_ptr__,&local_1c0);
        local_1c4 = kNone;
        bVar1 = commissioner::operator!=(pEVar6,&local_1c4);
        Error::~Error(&local_1c0);
        if (bVar1) {
          bVar1 = true;
        }
        else {
          std::
          vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
          ::emplace_back<ot::commissioner::ChannelMaskEntry&>
                    ((vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
                      *)aExpr_local,(ChannelMaskEntry *)local_168);
          bVar1 = false;
        }
      }
      ChannelMaskEntry::~ChannelMaskEntry((ChannelMaskEntry *)local_168);
      if (bVar1) {
        if (!bVar1) goto LAB_00265371;
        break;
      }
    }
  }
  local_c9 = 1;
LAB_00265371:
  if ((local_c9 & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::ParseChannelMask(ChannelMask &aChannelMask, const Expression &aExpr, size_t aIndex)
{
    Error error;

    VerifyOrExit(aExpr.size() >= aIndex && ((aExpr.size() - aIndex) % 2 == 0),
                 error = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    for (size_t i = aIndex; i < aExpr.size(); i += 2)
    {
        ChannelMaskEntry entry;
        SuccessOrExit(error = ParseInteger(entry.mPage, aExpr[i]));
        SuccessOrExit(error = utils::Hex(entry.mMasks, aExpr[i + 1]));
        aChannelMask.emplace_back(entry);
    }

exit:
    return error;
}